

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot.cpp
# Opt level: O1

tuple<ImageSize,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* eval_args_abi_cxx11_
            (tuple<ImageSize,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ImageSize IVar4;
  runtime_error *this;
  string filename;
  string colors;
  allocator<char> local_89;
  double local_88;
  double local_80;
  double local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (argc == 10) {
    IVar4.width = eval_arg<int>(argv[1],1,100000);
    iVar1 = eval_arg<int>(argv[2],1,100000);
    iVar2 = eval_arg<int>(argv[3],1,1000000000);
    iVar3 = eval_arg<int>(argv[4],1,1000000);
    local_78 = eval_arg<double>(argv[5],-100.0,100.0);
    local_80 = eval_arg<double>(argv[6],-100.0,100.0);
    local_88 = eval_arg<double>(argv[7],-100.0,100.0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,argv[8],(allocator<char> *)&local_70);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,argv[9],&local_89);
    std::_Tuple_impl<4ul,std::__cxx11::string,std::__cxx11::string>::
    _Tuple_impl<std::__cxx11::string&,std::__cxx11::string&,void>
              ((_Tuple_impl<4ul,std::__cxx11::string,std::__cxx11::string> *)__return_storage_ptr__,
               &local_50,&local_70);
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_ImageSize,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).
    super__Tuple_impl<1UL,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<2UL,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<3UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .super__Head_base<3UL,_int,_false>._M_head_impl = iVar3;
    *(int *)&(__return_storage_ptr__->
             super__Tuple_impl<0UL,_ImageSize,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).
             super__Tuple_impl<1UL,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .
             super__Tuple_impl<2UL,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .
             super__Tuple_impl<3UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .field_0x44 = iVar2;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_ImageSize,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).
    super__Tuple_impl<1UL,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .super__Head_base<1UL,_Section,_false>._M_head_impl.center_x = local_78;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_ImageSize,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).
    super__Tuple_impl<1UL,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .super__Head_base<1UL,_Section,_false>._M_head_impl.center_y = local_80;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_ImageSize,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).
    super__Tuple_impl<1UL,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .super__Head_base<1UL,_Section,_false>._M_head_impl.height = local_88;
    IVar4.height = iVar1;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_ImageSize,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).super__Head_base<0UL,_ImageSize,_false>._M_head_impl = IVar4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"invalid number of arguments");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

auto eval_args(const int argc, char const* argv[])
{
    if (argc != 10)
        throw std::runtime_error("invalid number of arguments");

    auto image_width    = eval_arg(argv[1], 1, 100000);
    auto image_height   = eval_arg(argv[2], 1, 100000);
    auto max_iterations = eval_arg(argv[3], 1, 1000000000);
    auto repetitions    = eval_arg(argv[4], 1, 1000000);
    auto center_x       = eval_arg(argv[5], -100.0, 100.0);
    auto center_y       = eval_arg(argv[6], -100.0, 100.0);
    auto height         = eval_arg(argv[7], -100.0, 100.0);
    auto colors         = std::string{argv[8]};
    auto filename       = std::string{argv[9]};

    return std::make_tuple(ImageSize{image_width, image_height}, Section{center_x, center_y, height}, max_iterations, repetitions, colors, filename);
}